

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles2::Functional::eval_selection_vec2(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  undefined8 local_18 [2];
  int local_8 [2];
  
  local_18[0] = CONCAT44(c->in[2].m_data[1],c->in[2].m_data[2]);
  if (0.0 < c->in[0].m_data[2]) {
    local_18[0] = CONCAT44(c->in[1].m_data[0],c->in[1].m_data[1]);
  }
  local_8[0] = 1;
  local_8[1] = 2;
  lVar1 = 0;
  do {
    (c->color).m_data[local_8[lVar1]] = *(float *)((long)local_18 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

void eval_selection_vec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,		c.in[1].swizzle(1, 0),			c.in[2].swizzle(2, 1)); }